

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall AggressiveBotStrategy::reinforceArmyCount(AggressiveBotStrategy *this)

{
  Country *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  reference ppCVar4;
  Country *country;
  iterator __end1;
  iterator __begin1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1;
  Country *biggest;
  AggressiveBotStrategy *this_local;
  
  __range1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0;
  this_01 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
  __end1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(this_01);
  country = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                *)&country);
    if (!bVar1) {
      if (__range1 != (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
        iVar2 = Map::Country::getCountryId((Country *)__range1);
        iVar3 = Map::Country::getCountryId((this->super_PlayerStrategy).to);
        if (iVar2 == iVar3) {
          std::ostream::operator<<(&std::cout,*(this->super_PlayerStrategy).armiesToPlace);
          return *(this->super_PlayerStrategy).armiesToPlace;
        }
      }
      std::operator<<((ostream *)&std::cout,"0");
      return 0;
    }
    ppCVar4 = __gnu_cxx::
              __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppCVar4;
    if (__range1 == (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
LAB_0010c94b:
      __range1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)this_00;
    }
    else {
      iVar2 = Map::Country::getNumberOfTroops(this_00);
      iVar3 = Map::Country::getNumberOfTroops((Country *)__range1);
      if (iVar3 < iVar2) goto LAB_0010c94b;
    }
    __gnu_cxx::
    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

int AggressiveBotStrategy::reinforceArmyCount() {
    Map::Country* biggest = nullptr;
    for (auto* country : *player->getOwnedCountries()) {
        if (biggest == nullptr || country->getNumberOfTroops() > biggest->getNumberOfTroops()) {
            biggest = country;
        }
    }

    if (biggest != nullptr && biggest->getCountryId() == to->getCountryId()) {
        std::cout << *armiesToPlace;
        return *armiesToPlace;
    }
    std::cout << "0";
    return 0;
}